

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O0

Template * __thiscall
ctemplate::TemplateCache::GetTemplate(TemplateCache *this,TemplateString *filename,Strip strip)

{
  mapped_type *pmVar1;
  RefcountedTemplate *local_60;
  RefcountedTemplate *refcounted_tpl;
  WriterMutexLock ml;
  CachedTemplate retval;
  undefined1 local_38 [8];
  TemplateCacheKey cache_key;
  Strip strip_local;
  TemplateString *filename_local;
  TemplateCache *this_local;
  
  cache_key._12_4_ = strip;
  retval._8_8_ = TemplateString::GetGlobalId(filename);
  std::pair<unsigned_long,_int>::pair<unsigned_long,_ctemplate::Strip_&,_true>
            ((pair<unsigned_long,_int> *)local_38,(unsigned_long *)&retval.should_reload,
             (Strip *)&cache_key.field_0xc);
  CachedTemplate::CachedTemplate((CachedTemplate *)&ml);
  WriterMutexLock::WriterMutexLock((WriterMutexLock *)&refcounted_tpl,this->mutex_);
  local_60 = GetTemplateLocked(this,filename,cache_key._12_4_,(pair<unsigned_long,_int> *)local_38);
  if (local_60 == (RefcountedTemplate *)0x0) {
    this_local = (TemplateCache *)0x0;
  }
  else {
    RefcountedTemplate::IncRef(local_60);
    pmVar1 = std::
             unordered_map<ctemplate::TemplateCache::RefcountedTemplate_*,_int,_ctemplate::TemplateCache::RefTplPtrHash,_std::equal_to<ctemplate::TemplateCache::RefcountedTemplate_*>,_std::allocator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>_>_>
             ::operator[](this->get_template_calls_,&local_60);
    *pmVar1 = *pmVar1 + 1;
    this_local = (TemplateCache *)RefcountedTemplate::tpl(local_60);
  }
  WriterMutexLock::~WriterMutexLock((WriterMutexLock *)&refcounted_tpl);
  return (Template *)this_local;
}

Assistant:

const Template *TemplateCache::GetTemplate(const TemplateString& filename,
                                           Strip strip) {
  // No need to have the cache-mutex acquired for this step
  TemplateCacheKey cache_key = TemplateCacheKey(filename.GetGlobalId(), strip);
  CachedTemplate retval;
  WriterMutexLock ml(mutex_);
  RefcountedTemplate* refcounted_tpl =
      GetTemplateLocked(filename, strip, cache_key);
  if (!refcounted_tpl)
    return NULL;

  refcounted_tpl->IncRef();   // DecRef() is in DoneWithGetTemplatePtrs()
  (*get_template_calls_)[refcounted_tpl]++;   // set up for DoneWith...()
  return refcounted_tpl->tpl();
}